

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O0

dw_dungeon_tile translate_town_tile(dw_town_tile tile)

{
  dw_dungeon_tile local_c;
  dw_town_tile tile_local;
  
  switch(tile) {
  case TOWN_TILE_GRASS:
  case TOWN_TILE_DESERT:
  case TOWN_TILE_BRICK:
  case TOWN_TILE_TREES:
  case TOWN_TILE_SWAMP:
  case TOWN_TILE_BARRIER:
  case TOWN_TILE_BRIDGE:
    local_c = DUNGEON_TILE_BRICK;
    break;
  case TOWN_TILE_WATER:
  case TOWN_TILE_BLOCK:
  case TOWN_TILE_WPN_SIGN:
  case TOWN_TILE_INN_SIGN:
  case TOWN_TILE_COUNTER:
    local_c = DUNGEON_TILE_BLOCK;
    break;
  case TOWN_TILE_CHEST:
    local_c = DUNGEON_TILE_CHEST;
    break;
  case TOWN_TILE_STAIRS_UP:
    local_c = DUNGEON_TILE_STAIRS_UP;
    break;
  case TOWN_TILE_STAIRS_DOWN:
    local_c = DUNGEON_TILE_STAIRS_DOWN;
    break;
  case TOWN_TILE_DOOR:
    local_c = DUNGEON_TILE_DOOR;
  }
  return local_c;
}

Assistant:

static dw_dungeon_tile translate_town_tile(dw_town_tile tile)
{
    switch(tile) {
        case TOWN_TILE_STAIRS_UP:
            return DUNGEON_TILE_STAIRS_UP;
        case TOWN_TILE_STAIRS_DOWN:
            return DUNGEON_TILE_STAIRS_DOWN;
        case TOWN_TILE_CHEST:
            return DUNGEON_TILE_CHEST;
        case TOWN_TILE_DOOR:
            return DUNGEON_TILE_DOOR;
        case TOWN_TILE_GRASS:
        case TOWN_TILE_DESERT:
        case TOWN_TILE_BRICK:
        case TOWN_TILE_TREES:
        case TOWN_TILE_SWAMP:
        case TOWN_TILE_BARRIER:
        case TOWN_TILE_BRIDGE:
            return DUNGEON_TILE_BRICK;
        case TOWN_TILE_WATER:
        case TOWN_TILE_BLOCK:
        case TOWN_TILE_WPN_SIGN:
        case TOWN_TILE_INN_SIGN:
        case TOWN_TILE_COUNTER:
            return DUNGEON_TILE_BLOCK;
    }

}